

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

uint32_t float128_to_uint32_round_to_zero_riscv32(float128 a,float_status *status)

{
  byte bVar1;
  uint64_t uVar2;
  
  bVar1 = status->float_exception_flags;
  uVar2 = float128_to_uint64_round_to_zero_riscv32(a,status);
  if (uVar2 >> 0x20 != 0) {
    status->float_exception_flags = bVar1 | 1;
    uVar2 = 0xffffffffffffffff;
  }
  return (uint32_t)uVar2;
}

Assistant:

uint32_t float128_to_uint32_round_to_zero(float128 a, float_status *status)
{
    uint64_t v;
    uint32_t res;
    int old_exc_flags = get_float_exception_flags(status);

    v = float128_to_uint64_round_to_zero(a, status);
    if (v > 0xffffffff) {
        res = 0xffffffff;
    } else {
        return v;
    }
    set_float_exception_flags(old_exc_flags, status);
    float_raise(float_flag_invalid, status);
    return res;
}